

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::ConvolutionLayerParams::ByteSizeLong(ConvolutionLayerParams *this)

{
  bool bVar1;
  int iVar2;
  ConvolutionPaddingTypeCase CVar3;
  size_t sVar4;
  size_t sVar5;
  uint64 uVar6;
  int cached_size;
  int cached_size_4;
  size_t data_size_3;
  int cached_size_3;
  size_t data_size_2;
  int cached_size_2;
  size_t data_size_1;
  int cached_size_1;
  size_t data_size;
  size_t total_size;
  ConvolutionLayerParams *this_local;
  
  data_size = 0;
  sVar4 = google::protobuf::internal::WireFormatLite::UInt64Size(&this->kernelsize_);
  if (sVar4 != 0) {
    sVar5 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar4);
    data_size = sVar5 + 2;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sVar4);
  this->_kernelsize_cached_byte_size_ = iVar2;
  data_size = sVar4 + data_size;
  sVar4 = google::protobuf::internal::WireFormatLite::UInt64Size(&this->stride_);
  if (sVar4 != 0) {
    sVar5 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar4);
    data_size = sVar5 + 2 + data_size;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sVar4);
  this->_stride_cached_byte_size_ = iVar2;
  data_size = sVar4 + data_size;
  sVar4 = google::protobuf::internal::WireFormatLite::UInt64Size(&this->dilationfactor_);
  if (sVar4 != 0) {
    sVar5 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar4);
    data_size = sVar5 + 2 + data_size;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sVar4);
  this->_dilationfactor_cached_byte_size_ = iVar2;
  data_size = sVar4 + data_size;
  sVar4 = google::protobuf::internal::WireFormatLite::UInt64Size(&this->outputshape_);
  if (sVar4 != 0) {
    sVar5 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar4);
    data_size = sVar5 + 2 + data_size;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sVar4);
  this->_outputshape_cached_byte_size_ = iVar2;
  data_size = sVar4 + data_size;
  bVar1 = has_weights(this);
  if (bVar1) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->weights_);
    data_size = sVar4 + 2 + data_size;
  }
  bVar1 = has_bias(this);
  if (bVar1) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->bias_);
    data_size = sVar4 + 2 + data_size;
  }
  uVar6 = outputchannels(this);
  if (uVar6 != 0) {
    uVar6 = outputchannels(this);
    sVar4 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar6);
    data_size = sVar4 + 1 + data_size;
  }
  uVar6 = kernelchannels(this);
  if (uVar6 != 0) {
    uVar6 = kernelchannels(this);
    sVar4 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar6);
    data_size = sVar4 + 1 + data_size;
  }
  uVar6 = ngroups(this);
  if (uVar6 != 0) {
    uVar6 = ngroups(this);
    sVar4 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar6);
    data_size = sVar4 + 1 + data_size;
  }
  bVar1 = isdeconvolution(this);
  if (bVar1) {
    data_size = data_size + 3;
  }
  bVar1 = hasbias(this);
  if (bVar1) {
    data_size = data_size + 3;
  }
  CVar3 = ConvolutionPaddingType_case(this);
  if (CVar3 != CONVOLUTIONPADDINGTYPE_NOT_SET) {
    if (CVar3 == kValid) {
      sVar4 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::ValidPadding>
                        ((this->ConvolutionPaddingType_).valid_);
      data_size = sVar4 + 2 + data_size;
    }
    else if (CVar3 == kSame) {
      sVar4 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::SamePadding>
                        ((this->ConvolutionPaddingType_).same_);
      data_size = sVar4 + 2 + data_size;
    }
  }
  iVar2 = google::protobuf::internal::ToCachedSize(data_size);
  this->_cached_size_ = iVar2;
  return data_size;
}

Assistant:

size_t ConvolutionLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ConvolutionLayerParams)
  size_t total_size = 0;

  // repeated uint64 kernelSize = 20;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->kernelsize_);
    if (data_size > 0) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _kernelsize_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated uint64 stride = 30;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->stride_);
    if (data_size > 0) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _stride_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated uint64 dilationFactor = 40;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->dilationfactor_);
    if (data_size > 0) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _dilationfactor_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated uint64 outputShape = 100;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->outputshape_);
    if (data_size > 0) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _outputshape_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.WeightParams weights = 90;
  if (this->has_weights()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->weights_);
  }

  // .CoreML.Specification.WeightParams bias = 91;
  if (this->has_bias()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->bias_);
  }

  // uint64 outputChannels = 1;
  if (this->outputchannels() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->outputchannels());
  }

  // uint64 kernelChannels = 2;
  if (this->kernelchannels() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->kernelchannels());
  }

  // uint64 nGroups = 10;
  if (this->ngroups() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->ngroups());
  }

  // bool isDeconvolution = 60;
  if (this->isdeconvolution() != 0) {
    total_size += 2 + 1;
  }

  // bool hasBias = 70;
  if (this->hasbias() != 0) {
    total_size += 2 + 1;
  }

  switch (ConvolutionPaddingType_case()) {
    // .CoreML.Specification.ValidPadding valid = 50;
    case kValid: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ConvolutionPaddingType_.valid_);
      break;
    }
    // .CoreML.Specification.SamePadding same = 51;
    case kSame: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ConvolutionPaddingType_.same_);
      break;
    }
    case CONVOLUTIONPADDINGTYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}